

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O2

void __thiscall CProjectile::Tick(CProjectile *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  CGameWorld *pCVar4;
  IServer *pIVar5;
  vec2 Force;
  vec2 vVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  CCharacter *pCVar10;
  long in_FS_OFFSET;
  float fVar11;
  vec2 CurPos;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (this->super_CEntity).m_pGameWorld;
  pIVar5 = pCVar4->m_pServer;
  iVar9 = pIVar5->m_CurrentGameTick;
  uVar1 = this->m_StartTick;
  fVar11 = (float)pIVar5->m_TickSpeed;
  vVar6 = GetPos(this,(float)(int)(~uVar1 + iVar9) / fVar11);
  CurPos = GetPos(this,(float)(int)(iVar9 - uVar1) / fVar11);
  iVar8 = CCollision::IntersectLine
                    (&pCVar4->m_pGameServer->m_Collision,vVar6,CurPos,&CurPos,(vec2 *)0x0);
  pCVar10 = CGameContext::GetPlayerChar
                      (((this->super_CEntity).m_pGameWorld)->m_pGameServer,this->m_Owner);
  pCVar10 = CGameWorld::IntersectCharacter
                      ((this->super_CEntity).m_pGameWorld,vVar6,CurPos,6.0,&CurPos,
                       &pCVar10->super_CEntity);
  iVar2 = this->m_LifeSpan;
  iVar9 = iVar2 + -1;
  this->m_LifeSpan = iVar9;
  if (0 < iVar2 && (iVar8 == 0 && pCVar10 == (CCharacter *)0x0)) {
    bVar7 = CEntity::GameLayerClipped(&this->super_CEntity,CurPos);
    if (!bVar7) goto LAB_001135a9;
    iVar9 = this->m_LifeSpan;
  }
  if ((-1 < iVar9) || (this->m_Weapon == 3)) {
    CGameContext::CreateSound
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,CurPos,this->m_SoundImpact,-1);
  }
  if (this->m_Explosive == true) {
    CGameContext::CreateExplosion
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,CurPos,this->m_Owner,
               this->m_Weapon,this->m_Damage);
  }
  else if (pCVar10 != (CCharacter *)0x0) {
    fVar11 = 0.001;
    if (0.001 <= this->m_Force) {
      fVar11 = this->m_Force;
    }
    vVar6 = this->m_Direction;
    Force.field_1.y = fVar11 * vVar6.field_1.y;
    Force.field_0.x = fVar11 * vVar6.field_0.x;
    CCharacter::TakeDamage
              (pCVar10,Force,(vec2)((ulong)vVar6 ^ 0x8000000080000000),this->m_Damage,this->m_Owner,
               this->m_Weapon);
  }
  CGameWorld::DestroyEntity((this->super_CEntity).m_pGameWorld,&this->super_CEntity);
LAB_001135a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CProjectile::Tick()
{
	float Pt = (Server()->Tick()-m_StartTick-1)/(float)Server()->TickSpeed();
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();
	vec2 PrevPos = GetPos(Pt);
	vec2 CurPos = GetPos(Ct);
	int Collide = GameServer()->Collision()->IntersectLine(PrevPos, CurPos, &CurPos, 0);
	CCharacter *OwnerChar = GameServer()->GetPlayerChar(m_Owner);
	CCharacter *TargetChr = GameWorld()->IntersectCharacter(PrevPos, CurPos, 6.0f, CurPos, OwnerChar);

	m_LifeSpan--;

	if(TargetChr || Collide || m_LifeSpan < 0 || GameLayerClipped(CurPos))
	{
		if(m_LifeSpan >= 0 || m_Weapon == WEAPON_GRENADE)
			GameServer()->CreateSound(CurPos, m_SoundImpact);

		if(m_Explosive)
			GameServer()->CreateExplosion(CurPos, m_Owner, m_Weapon, m_Damage);

		else if(TargetChr)
			TargetChr->TakeDamage(m_Direction * maximum(0.001f, m_Force), m_Direction*-1, m_Damage, m_Owner, m_Weapon);

		GameWorld()->DestroyEntity(this);
	}
}